

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_reduce_2k_setup(mp_int *a,mp_digit *d)

{
  int iVar1;
  mp_int tmp;
  mp_int local_30;
  
  iVar1 = mp_init(&local_30);
  if (iVar1 == 0) {
    iVar1 = mp_count_bits(a);
    iVar1 = mp_2expt(&local_30,iVar1);
    if ((iVar1 == 0) && (iVar1 = s_mp_sub(&local_30,a,&local_30), iVar1 == 0)) {
      *d = *local_30.dp;
      iVar1 = 0;
    }
    mp_clear(&local_30);
  }
  return iVar1;
}

Assistant:

int mp_reduce_2k_setup(mp_int *a, mp_digit *d)
{
   int res, p;
   mp_int tmp;
   
   if ((res = mp_init(&tmp)) != MP_OKAY) {
      return res;
   }
   
   p = mp_count_bits(a);
   if ((res = mp_2expt(&tmp, p)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   if ((res = s_mp_sub(&tmp, a, &tmp)) != MP_OKAY) {
      mp_clear(&tmp);
      return res;
   }
   
   *d = tmp.dp[0];
   mp_clear(&tmp);
   return MP_OKAY;
}